

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O0

_Bool file_stdio_fclose(ALLEGRO_FILE *f)

{
  int iVar1;
  USERDATA *file;
  undefined8 in_RDI;
  _Bool ret;
  void *unaff_retaddr;
  USERDATA *userdata;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  byte bVar2;
  int line;
  
  line = (int)((ulong)in_RDI >> 0x20);
  file = get_userdata((ALLEGRO_FILE *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8))
  ;
  if (file->fp == (FILE *)0x0) {
    bVar2 = true;
  }
  else {
    iVar1 = fclose((FILE *)file->fp);
    if (iVar1 != 0) {
      __errno_location();
      al_set_errno((int)((ulong)file >> 0x20));
    }
    bVar2 = iVar1 == 0;
  }
  al_free_with_context
            (unaff_retaddr,line,(char *)file,(char *)CONCAT17(bVar2,in_stack_ffffffffffffffe8));
  return (_Bool)(bVar2 & 1);
}

Assistant:

static bool file_stdio_fclose(ALLEGRO_FILE *f)
{
   USERDATA *userdata = get_userdata(f);
   bool ret;

   if (userdata->fp == NULL) {
      /* This can happen in the middle of al_fopen_fd. */
      ret = true;
   }
   else if (fclose(userdata->fp) == 0) {
      ret = true;
   }
   else {
      al_set_errno(errno);
      ret = false;
   }

   al_free(userdata);

   return ret;
}